

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O0

bool __thiscall pcap_reader::ReadNext(pcap_reader *this)

{
  uint32_t uVar1;
  short sVar2;
  size_t sVar3;
  uint8_t *puVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint local_58;
  int local_4c;
  int payload_type;
  int ip_length;
  size_t uint8_ts_read;
  uint8_t *new_buf;
  int new_size;
  bool ret;
  size_t nb_read;
  pcap_reader *this_local;
  
  sVar3 = fread(&this->frame_header,0x10,1,(FILE *)this->F_pcap);
  bVar6 = sVar3 == 1;
  this->ip_version = 0;
  this->ip_offset = 0;
  this->tp_version = 0;
  this->tp_offset = 0;
  this->tp_length = 0;
  this->tp_port1 = 0;
  this->tp_port2 = 0;
  this->is_fragment = false;
  this->fragment_length = 0;
  if (bVar6) {
    if (this->buffer_size < (this->frame_header).incl_len) {
      uVar1 = (this->frame_header).incl_len;
      puVar4 = (uint8_t *)operator_new__((ulong)(this->frame_header).incl_len);
      if (puVar4 == (uint8_t *)0x0) {
        bVar6 = false;
      }
      else {
        if ((this->buffer != (uint8_t *)0x0) && (this->buffer != (uint8_t *)0x0)) {
          operator_delete__(this->buffer);
        }
        this->buffer = puVar4;
        this->buffer_size = uVar1;
      }
    }
    if (bVar6 != false) {
      sVar3 = fread(this->buffer,1,(ulong)(this->frame_header).incl_len,(FILE *)this->F_pcap);
      bVar6 = sVar3 == (this->frame_header).incl_len;
    }
  }
  if ((bVar6 != false) && (((this->header).network == 1 || ((this->header).network == 0x65)))) {
    if ((this->header).network == 1) {
      sVar2 = CONCAT11(this->buffer[0xc],this->buffer[0xd]);
      this->ip_offset = 0xe;
      if ((sVar2 == 0x800) && ((int)(uint)this->buffer[this->ip_offset] >> 4 == 4)) {
        local_4c = 4;
      }
      else {
        bVar7 = false;
        if (sVar2 == -0x7923) {
          bVar7 = (int)(uint)this->buffer[this->ip_offset] >> 4 == 6;
        }
        local_4c = -1;
        if (bVar7) {
          local_4c = 6;
        }
      }
      this->ip_version = local_4c;
    }
    else {
      this->ip_offset = 0;
      this->ip_version = (int)(uint)this->buffer[this->ip_offset] >> 4;
    }
    if (this->ip_version == 4) {
      uVar5 = (uint)CONCAT11(this->buffer[this->ip_offset + 2],this->buffer[this->ip_offset + 3]);
      this->is_fragment = (this->buffer[this->ip_offset + 6] & 0x20) != 0;
      local_58 = uVar5;
      if ((this->is_fragment & 1U) != 0) {
        local_58 = (this->buffer[this->ip_offset + 6] & 0x1f) << 8 |
                   (uint)this->buffer[this->ip_offset + 7];
      }
      this->fragment_length = local_58;
      this->tp_offset = this->ip_offset + 0x14;
      this->tp_version = (uint)this->buffer[this->ip_offset + 9];
      this->tp_length = uVar5 - (this->tp_offset - this->ip_offset);
    }
    else if (this->ip_version == 6) {
      this->tp_offset = this->ip_offset + 0x28;
      this->tp_version = (uint)this->buffer[this->ip_offset + 6];
      this->tp_length =
           (uint)CONCAT11(this->buffer[this->ip_offset + 4],this->buffer[this->ip_offset + 5]);
    }
    if (this->tp_length != 0) {
      this->tp_port1 =
           (uint)CONCAT11(this->buffer[this->tp_offset],this->buffer[this->tp_offset + 1]);
      this->tp_port2 =
           (uint)CONCAT11(this->buffer[this->tp_offset + 2],this->buffer[this->tp_offset + 3]);
    }
  }
  return bVar6;
}

Assistant:

bool pcap_reader::ReadNext()
{
    size_t nb_read = fread(&frame_header, sizeof(frame_header), 1, F_pcap);
    bool ret = nb_read == 1;

    ip_version = 0;
    ip_offset = 0;
    tp_version = 0;
    tp_offset = 0;
    tp_length = 0;
    tp_port1 = 0;
    tp_port2 = 0;
    is_fragment = false;
    fragment_length = 0;

    if (ret)
    {

        if (is_wrong_endian)
        {
            /* TODO: swap the values */
        }

        if (frame_header.incl_len > buffer_size)
        {
            int new_size = frame_header.incl_len;
            uint8_t * new_buf = new uint8_t[frame_header.incl_len];
            if (new_buf == NULL)
            {
                ret = false;
            }
            else
            {
                if (buffer != NULL)
                {
                    delete[] buffer;
                }
                buffer = new_buf;
                buffer_size = new_size;
            }
        }

        if (ret)
        {
            size_t uint8_ts_read = fread(buffer, 1, frame_header.incl_len, F_pcap);
            ret = (uint8_ts_read == frame_header.incl_len);
        }
    }

    if (ret && (header.network == 1 || header.network == 101))
    {
        int ip_length;

        if (header.network == 1)
        {
            /* Ethernet */
            int payload_type = (buffer[12] << 8) | (buffer[13]);

            ip_offset = 14;
            ip_version = payload_type == 0x0800 && buffer[ip_offset] >> 4 == 4 ? 4
                : payload_type == 0x86DD && buffer[ip_offset] >> 4 == 6 ? 6
                : -1;
        }
        else
        {
            /* Raw */
            ip_offset = 0;
            ip_version = buffer[ip_offset] >> 4;
        }
        switch (ip_version)
        {
        case 4:
            /* IPv4 */
            ip_length = (buffer[ip_offset + 2] << 8) | (buffer[ip_offset + 3]);
            is_fragment = ((buffer[ip_offset + 6] & 0x20) != 0);
            fragment_length = (is_fragment) ?
                ((buffer[ip_offset + 6] & 0x1F) << 8) | (buffer[ip_offset + 7]) :
                ip_length;

            tp_offset = ip_offset + 20;
            tp_version = buffer[ip_offset + 9];
            tp_length = ip_length - (tp_offset - ip_offset);
            break;

        case 6:
            /* IPv6, 1 0 0 0 0 1 1 0 1 1 0 1 1 1 0 1 */
            tp_offset = ip_offset + 40;
            tp_version = buffer[ip_offset + 6];
            tp_length = (buffer[ip_offset + 4] << 8) | (buffer[ip_offset + 5]);
            break;
        default:
            break;
        }

        if (tp_length != 0)
        {
            tp_port1 = (buffer[tp_offset] << 8) | (buffer[tp_offset + 1]);
            tp_port2 = (buffer[tp_offset + 2] << 8) | (buffer[tp_offset + 3]);
        }
    }

    return ret;
}